

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slurp.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_istream<char,_std::char_traits<char>_> *in)

{
  byte bVar1;
  long lVar2;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t g;
  size_t sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *buffer;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined8 in_stack_ffffffffffffffa0;
  char __c;
  size_type in_stack_ffffffffffffffa8;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long local_30;
  allocator<char> local_12;
  undefined1 local_11;
  char *local_10;
  
  __c = (char)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_ffffffffffffffa8,__c,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::allocator<char>::~allocator(&local_12);
  pcVar3 = local_10;
  lVar2 = std::__cxx11::string::data();
  std::istream::read(pcVar3,lVar2);
  local_30 = std::istream::gcount();
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)in_RDI);
    pcVar3 = local_10;
    lVar2 = std::__cxx11::string::data();
    std::istream::read(pcVar3,lVar2 + local_30);
    lVar2 = std::istream::gcount();
    local_30 = lVar2 + local_30;
  }
  std::__cxx11::string::resize((ulong)in_RDI);
  return this;
}

Assistant:

std::basic_string<CharT, Traits, Allocator> slurp_string(
    std::basic_istream<CharT, Traits> &in) {
    // create buffer
    std::basic_string<CharT, Traits, Allocator> buffer(
        8192, static_cast<CharT>('\0'));
    std::size_t sz = 0;

    // read into buffer
    in.read(buffer.data() + sz, 8192);
    // count how many values we read
    std::size_t g = in.gcount();
    sz += g;
    while(!in.eof()) {
        // allocate more space
        buffer.resize(buffer.size() + 8192);
        // Keep reading
        in.read(buffer.data() + sz, 8192);
        // count how many values we read
        g = in.gcount();
        sz += g;
    }
    // shrink buffer
    buffer.resize(sz);
    return buffer;
}